

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(NodeRecordMB4D *__return_storage_ptr__,
         BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
         *this,BuildRecord *current,CachedAllocator alloc,bool toplevel)

{
  size_t *psVar1;
  range<unsigned_long> *prVar2;
  atomic<unsigned_long> *paVar3;
  char *pcVar4;
  float fVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  PrimRefVector pmVar8;
  PrimRefVector pmVar9;
  PrimRefMB *pPVar10;
  MemoryMonitorInterface *pMVar11;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar12;
  undefined8 *puVar13;
  PrimRefVector pmVar14;
  ThreadLocal2 *pTVar15;
  Split *pSVar16;
  SetMB *pSVar17;
  vint *pvVar18;
  code *pcVar19;
  unsigned_long end_00;
  float fVar20;
  undefined1 auVar21 [16];
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar27;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar28;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar29;
  char cVar30;
  size_t i_1;
  long *plVar31;
  MutexSys *this_00;
  size_t sVar32;
  BBox1f BVar33;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var34;
  void *pvVar35;
  runtime_error *prVar36;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar38;
  float *pfVar39;
  unsigned_long *puVar40;
  BBox1f BVar41;
  unsigned_long uVar42;
  byte bVar43;
  size_t end;
  long lVar44;
  undefined1 *puVar45;
  char *pcVar46;
  ulong uVar47;
  ulong uVar48;
  BBox1f *pBVar49;
  size_t sVar50;
  size_t i;
  size_t sVar51;
  SetMB *set;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  _Var52;
  size_t begin;
  BBox1f BVar53;
  BuildRecord *current_00;
  size_t i_4;
  bool bVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1a48 [16];
  undefined1 local_1a38 [16];
  undefined1 local_1a28 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector_1;
  undefined1 local_1a08 [16];
  BBox1f time_range1_1;
  BBox1f time_range0_1;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_19c8;
  __uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  local_19c0;
  PrimRefVector lprims_1;
  PrimRefVector lprims;
  undefined8 local_19a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_19a0;
  undefined1 local_1990 [8];
  anon_class_24_3_c5d13451 isLeft;
  undefined1 auStack_1970 [24];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1958;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1948;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1938;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1928 [3];
  BBox1f local_18f0;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_18e8;
  vbool vSplitMask;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18a8 [7];
  BBox1f time_range1;
  anon_class_1_0_00000001 reduction2_1;
  undefined1 local_17f8 [16];
  anon_class_1_0_00000001 reduction;
  unsigned_long local_1788;
  unsigned_long uStack_1780;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1748;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1738;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1728 [4];
  size_t local_16e8;
  size_t local_16e0;
  BBox1f local_16c0;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_16b8;
  anon_class_1_0_00000001 reduction2;
  unsigned_long local_1648;
  unsigned_long local_1640;
  BBox1f time_range0;
  anon_union_4_2_620955e9_for_BinSplit<32UL>_3 local_1610;
  uint uStack_160c;
  size_t sStack_1608;
  vint vSplitPos_1;
  Split csplit;
  SetMB local_1508;
  SetMB local_1468;
  LocalChildList_conflict children;
  NodeRecordMB4D values [16];
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc).super_Create.allocator;
    plVar31 = (long *)__tls_get_addr(&PTR_021f8d38);
    this_00 = (MutexSys *)*plVar31;
    if (this_00 == (MutexSys *)0x0) {
      this_00 = (MutexSys *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys(this_00);
      this_00[1].mutex = (void *)0x0;
      this_00[8].mutex = this_00;
      auVar56 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_00 + 9) = ZEXT1632(auVar56);
      *(undefined1 (*) [32])(this_00 + 0xb) = ZEXT1632(auVar56);
      this_00[0x10].mutex = this_00;
      *(undefined1 (*) [32])(this_00 + 0x11) = ZEXT1632(auVar56);
      *(undefined1 (*) [32])(this_00 + 0x13) = ZEXT1632(auVar56);
      *plVar31 = (long)this_00;
      children.children.items[0].depth = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      children.children.items[0]._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      values[0].ref.ptr = (size_t)this_00;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)values);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)values);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
    }
    alloc.talloc0 = (ThreadLocal *)(this_00 + 8);
    alloc.talloc1 = (ThreadLocal *)(this_00 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     (sVar50 = (current->prims).super_PrimInfoMB.object_range._end -
               (current->prims).super_PrimInfoMB.object_range._begin,
     sVar50 <= (this->cfg).singleThreadThreshold)) {
    Scene::BuildProgressMonitorInterface::operator()(&this->progressMonitor,sVar50);
  }
  pSVar17 = &current->prims;
  find(&csplit,this,pSVar17);
  bVar43 = (byte)(this->cfg).logBlockSize;
  sVar50 = (current->prims).super_PrimInfoMB.object_range._end;
  sVar51 = (current->prims).super_PrimInfoMB.object_range._begin;
  uVar48 = sVar50 - sVar51;
  if ((uVar48 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) {
LAB_00ce5dbe:
    SetMB::deterministic_order(pSVar17);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,current,alloc_00);
    return __return_storage_ptr__;
  }
  fVar55 = (current->prims).super_PrimInfoMB.time_range.upper;
  fVar5 = (current->prims).super_PrimInfoMB.time_range.lower;
  if (uVar48 <= (this->cfg).maxLeafSize) {
    auVar67 = vsubps_avx((undefined1  [16])
                         (current->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                         field_0,(undefined1  [16])
                                 (current->prims).super_PrimInfoMB.
                                 super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                                 lower.field_0);
    auVar57 = vsubps_avx((undefined1  [16])
                         (current->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                         field_0,(undefined1  [16])
                                 (current->prims).super_PrimInfoMB.
                                 super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                                 lower.field_0);
    auVar56 = vmovshdup_avx(auVar67);
    auVar21 = vshufpd_avx(auVar67,auVar67,1);
    auVar66 = vmovshdup_avx(auVar57);
    auVar65 = vshufpd_avx(auVar57,auVar57,1);
    fVar20 = (fVar55 - fVar5) *
             ((auVar56._0_4_ + auVar21._0_4_) * auVar67._0_4_ + auVar56._0_4_ * auVar21._0_4_ +
             (auVar65._0_4_ + auVar66._0_4_) * auVar57._0_4_ + auVar65._0_4_ * auVar66._0_4_) * 0.5;
    fVar78 = (this->cfg).intCost;
    if (fVar78 * fVar20 * (float)(~(-1L << (bVar43 & 0x3f)) +
                                  (current->prims).super_PrimInfoMB.num_time_segments >>
                                 (bVar43 & 0x3f)) <=
        fVar20 * (this->cfg).travCost + fVar78 * csplit.sah) goto LAB_00ce5dbe;
  }
  switch(csplit.data) {
  case 0:
    children.children.items[0].depth = 0x7f8000007f800000;
    children.children.items[0]._8_4_ = 0x7f800000;
    children.children.items[0]._12_4_ = 0x7f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._0_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._8_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._begin = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._end = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._0_4_ = 0;
    auVar72._8_4_ = 0x3f800000;
    auVar72._0_8_ = 0x3f8000003f800000;
    auVar72._12_4_ = 0x3f800000;
    uVar6 = vmovlps_avx(auVar72);
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._4_4_ = (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ = 0;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_4_ = 0x7f800000;
    values[0]._12_4_ = 0x7f800000;
    values[0].lbounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[3] = INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[3] = INFINITY;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_4_ = 0xff800000;
    values[0]._92_4_ = 0xff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    values[1].lbounds.bounds0.upper.field_0._4_8_ = vmovlps_avx(auVar72);
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    auVar21._4_4_ = csplit.data;
    auVar21._0_4_ = csplit.field_2.pos;
    auVar21._8_8_ = csplit.mapping.num;
    vSplitPos.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar21,0);
    isLeft.vSplitPos = &vSplitPos;
    lVar44 = (long)(1 << ((byte)csplit.dim & 0x1f)) * 0x10;
    vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar44);
    vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar44 + 8);
    isLeft.vSplitMask = &vSplitMask;
    isLeft.split = &csplit;
    sVar32 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                       (((current->prims).prims)->items,sVar51,sVar50,(EmptyTy *)&vSplitPos_1,
                        (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children,
                        (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,&isLeft,&reduction,
                        &reduction2,0x80,0xc00);
    pmVar8 = (current->prims).prims;
    local_1a08._8_8_ = 0;
    local_1a08._0_4_ = (current->prims).super_PrimInfoMB.time_range.lower;
    local_1a08._4_4_ = (current->prims).super_PrimInfoMB.time_range.upper;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              (&local_1468.super_PrimInfoMB,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children
              );
    auVar57._8_8_ = 0;
    auVar57._0_4_ = local_1468.super_PrimInfoMB.time_range.lower;
    auVar57._4_4_ = local_1468.super_PrimInfoMB.time_range.upper;
    auVar56 = vcmpps_avx(auVar57,local_1a08,1);
    auVar66 = vinsertps_avx(local_1a08,auVar57,0x50);
    auVar21 = vinsertps_avx(auVar57,local_1a08,0x50);
    auVar56 = vblendvps_avx(auVar21,auVar66,auVar56);
    local_1468.super_PrimInfoMB.time_range = (BBox1f)vmovlps_avx(auVar56);
    pmVar9 = (current->prims).prims;
    local_1a08._8_8_ = 0;
    local_1a08._0_4_ = (current->prims).super_PrimInfoMB.time_range.lower;
    local_1a08._4_4_ = (current->prims).super_PrimInfoMB.time_range.upper;
    local_1468.super_PrimInfoMB.object_range._begin = sVar51;
    local_1468.super_PrimInfoMB.object_range._end = sVar32;
    local_1468.prims = pmVar8;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              (&local_1508.super_PrimInfoMB,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values);
    auVar58._8_8_ = 0;
    auVar58._0_4_ = local_1508.super_PrimInfoMB.time_range.lower;
    auVar58._4_4_ = local_1508.super_PrimInfoMB.time_range.upper;
    auVar56 = vcmpps_avx(auVar58,local_1a08,1);
    auVar66 = vinsertps_avx(local_1a08,auVar58,0x50);
    auVar21 = vinsertps_avx(auVar58,local_1a08,0x50);
    auVar56 = vblendvps_avx(auVar21,auVar66,auVar56);
    local_1508.super_PrimInfoMB.time_range = (BBox1f)vmovlps_avx(auVar56);
    local_1508.super_PrimInfoMB.object_range._begin = sVar32;
    local_1508.super_PrimInfoMB.object_range._end = sVar50;
    local_1508.prims = pmVar9;
    break;
  case 1:
    SetMB::deterministic_order(pSVar17);
    splitFallback(this,pSVar17,&local_1468,&local_1508);
    break;
  case 2:
    time_range0.upper = csplit.field_2.fpos;
    time_range1.upper = fVar55;
    time_range1.lower = csplit.field_2.fpos;
    BVar33 = (BBox1f)(current->prims).prims;
    time_range0.lower = fVar5;
    _Var34.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )::operator_new(0x28);
    pMVar11 = (this->heuristicTemporalSplit).device;
    *(MemoryMonitorInterface **)
     _Var34.
     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     .
     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
     ._M_head_impl = pMVar11;
    *(undefined1 *)
     ((long)_Var34.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl + 8) = 0;
    uVar47 = uVar48 * 0x50;
    *(long *)((long)_Var34.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x10) = 0;
    *(long *)((long)_Var34.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x18) = 0;
    *(long *)((long)_Var34.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x20) = 0;
    (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,uVar47,0);
    if (uVar47 < 0x1c00000) {
      pvVar35 = alignedMalloc(uVar47,0x10);
    }
    else {
      pvVar35 = os_malloc(uVar47,(bool *)((long)_Var34.
                                                super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                .
                                                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                ._M_head_impl + 8));
    }
    local_18c8._0_8_ = &this->heuristicTemporalSplit;
    *(void **)((long)_Var34.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x20) = pvVar35;
    *(ulong *)((long)_Var34.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x10) = uVar48;
    *(ulong *)((long)_Var34.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x18) = uVar48;
    local_18c8._8_8_ = &lprims;
    pSVar16 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pvVar18 = (vint *)(current->prims).super_PrimInfoMB.object_range._end;
    children.children.items[0].depth = 0x7f8000007f800000;
    children.children.items[0]._8_4_ = 0x7f800000;
    children.children.items[0]._12_4_ = 0x7f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._0_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._8_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._begin = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._end = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._0_4_ = 0;
    auVar56._8_4_ = 0x3f800000;
    auVar56._0_8_ = 0x3f8000003f800000;
    auVar56._12_4_ = 0x3f800000;
    uVar6 = vmovlps_avx(auVar56);
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._4_4_ = (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ = 0;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )_Var34.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    lprims = (PrimRefVector)
             _Var34.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    vSplitMask.field_0._0_8_ = BVar33;
    vSplitMask.field_0._8_8_ = &time_range0;
    if ((ulong)((long)pvVar18 - (long)pSVar16) < 0xc00) {
      isLeft.split = pSVar16;
      isLeft.vSplitPos = pvVar18;
      ::anon_func::anon_class_40_5_808acc65::operator()
                ((PrimInfoMB *)values,(anon_class_40_5_808acc65 *)&vSplitMask,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
      vSplitPos.field_0.v[1] = (longlong)pSVar16;
      vSplitPos.field_0.v[0] = (longlong)pvVar18;
      local_1748._0_8_ = 0x80;
      _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,(d1 *)&vSplitPos,
                 (blocked_range<unsigned_long> *)&children,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                 (anon_class_16_2_ed117de8_conflict29 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&isLeft,(task_group_context *)this);
      cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar30 != '\0') {
        prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar36,"task cancelled");
        __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
    }
    uVar42 = (current->prims).super_PrimInfoMB.object_range._end -
             (current->prims).super_PrimInfoMB.object_range._begin;
    if (values[1]._8_8_ - values[1].ref.ptr != uVar42) {
      children.children.items[0].depth = (size_t)&time_range0;
      values[1]._8_8_ =
           parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                     (lprims->items,0,uVar42,0x400,(anon_class_8_1_41ce32a5 *)&children);
    }
    pmVar14 = lprims;
    local_1a28._4_4_ = time_range0.upper;
    local_1a28._0_4_ = time_range0.lower;
    local_1a28._8_8_ = 0;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values);
    children.children.items[0].prims.super_PrimInfoMB.max_time_range = (BBox1f)pmVar14;
    auVar65._4_4_ = children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_;
    auVar65._0_4_ =
         (undefined4)children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments;
    auVar65._8_8_ = 0;
    auVar66 = vcmpps_avx(auVar65,local_1a28,1);
    auVar21 = vinsertps_avx(local_1a28,auVar65,0x50);
    auVar56 = vblendps_avx(auVar65,local_1a28,2);
    auVar56 = vblendvps_avx(auVar56,auVar21,auVar66);
    uVar6 = vmovlps_avx(auVar56);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    SetMB::operator=(&local_1468,(SetMB *)&children);
    prVar2 = &(current->prims).super_PrimInfoMB.object_range;
    pcVar19 = (code *)(current->prims).super_PrimInfoMB.object_range._end;
    aVar27._0_8_ = prVar2->_begin;
    aVar27._8_8_ = prVar2->_end;
    children.children.items[0].depth = 0x7f8000007f800000;
    children.children.items[0]._8_4_ = 0x7f800000;
    children.children.items[0]._12_4_ = 0x7f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._0_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._8_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._begin = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._end = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._0_4_ = 0;
    auVar66._8_4_ = 0x3f800000;
    auVar66._0_8_ = 0x3f8000003f800000;
    auVar66._12_4_ = 0x3f800000;
    uVar6 = vmovlps_avx(auVar66);
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._4_4_ = (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ = 0;
    _reduction2 = BVar33;
    if ((long)pcVar19 - prVar2->_begin < 0xc00) {
      vSplitPos.field_0 = aVar27;
      ::anon_func::anon_class_24_3_35f68c7c::operator()
                ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                 (range<unsigned_long> *)&vSplitPos);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
      vSplitPos_1.field_0.v[1] = (longlong)&reduction2;
      vSplitPos_1.field_0.v[0] = (longlong)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      _reduction = pcVar19;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&children,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitPos_1,
                 (anon_class_16_2_ed117de8_conflict30 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&vSplitPos,(task_group_context *)this);
      cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
      if (cVar30 != '\0') {
        prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar36,"task cancelled");
        __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
    }
    uVar42 = (current->prims).super_PrimInfoMB.object_range._begin;
    end_00 = (current->prims).super_PrimInfoMB.object_range._end;
    if (local_1928[0]._8_8_ - local_1928[0]._0_8_ != end_00 - uVar42) {
      children.children.items[0].depth = (size_t)&time_range1;
      parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                ((PrimRefMB *)
                 ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar33 + 0x20))->reduction,uVar42,
                 end_00,0x400,(anon_class_8_1_41ce32a6 *)&children);
    }
    local_1a28._8_8_ = 0;
    local_1a28._0_4_ = time_range1.lower;
    local_1a28._4_4_ = time_range1.upper;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
    auVar67._4_4_ = children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_;
    auVar67._0_4_ =
         (undefined4)children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments;
    auVar67._8_8_ = 0;
    auVar66 = vcmpps_avx(auVar67,local_1a28,1);
    auVar21 = vinsertps_avx(local_1a28,auVar67,0x50);
    auVar56 = vblendps_avx(auVar67,local_1a28,2);
    auVar56 = vblendvps_avx(auVar56,auVar21,auVar66);
    uVar6 = vmovlps_avx(auVar56);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    children.children.items[0].prims.super_PrimInfoMB.max_time_range = BVar33;
    SetMB::operator=(&local_1508,(SetMB *)&children);
    bVar43 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )new_vector._M_t.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl !=
             (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
    local_18b8._0_8_ = pSVar17;
    goto LAB_00ce607c;
  case 3:
    SetMB::deterministic_order(pSVar17);
    splitByGeometry(this,pSVar17,&local_1468,&local_1508);
  }
  new_vector._M_t.
  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  bVar43 = false;
LAB_00ce607c:
  children.numChildren = 1;
  local_1990 = (undefined1  [8])0x1;
  children.numSharedPrimVecs = 1;
  BuildRecord::operator=((BuildRecord *)&children,current);
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  children.sharedPrimVecs.items[0].prims = (current->prims).prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  isLeft.split = (Split *)(current->depth + 1);
  SetMB::SetMB((SetMB *)&isLeft.vSplitMask,&local_1468);
  vSplitPos.field_0.v[0] = current->depth + 1;
  SetMB::SetMB((SetMB *)&local_1748.field_1,&local_1508);
  sVar50 = children.numSharedPrimVecs;
  pSVar12 = children.primvecs.items[0];
  local_19c0._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        )(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )new_vector._M_t.
           super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           .
           super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
           ._M_head_impl;
  new_vector._M_t.
  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  if (local_18e8 == children.primvecs.items[0]->prims) {
    children.primvecs.items[0]->refCount = children.primvecs.items[0]->refCount + 1;
    pvVar37 = local_18e8;
  }
  else {
    pSVar28 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    pSVar29 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
    pSVar29->prims = local_18e8;
    children.sharedPrimVecs.items[sVar50].refCount = 1;
    pvVar37 = children.primvecs.items[0]->prims;
    children.primvecs.items[0] =
         (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
          *)&pSVar28->prims;
  }
  sVar50 = children.numSharedPrimVecs;
  if (local_16b8 == pvVar37) {
    children.primvecs.items[children.numChildren] = pSVar12;
    sVar50 = pSVar12->refCount;
    pSVar12->refCount = sVar50 + 1;
  }
  else {
    pSVar28 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    pSVar29 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
    pSVar29->prims = local_16b8;
    children.sharedPrimVecs.items[sVar50].refCount = 1;
    children.primvecs.items[children.numChildren] =
         (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
          *)&pSVar28->prims;
    sVar50 = pSVar12->refCount - 1;
  }
  pSVar12->refCount = sVar50;
  if (sVar50 == 0) {
    pvVar37 = pSVar12->prims;
    if (pvVar37 !=
        (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
         *)0x0) {
      sVar50 = pvVar37->size_alloced;
      pPVar10 = pvVar37->items;
      if (pPVar10 != (PrimRefMB *)0x0) {
        if (sVar50 * 0x50 < 0x1c00000) {
          alignedFree(pPVar10);
        }
        else {
          os_free(pPVar10,sVar50 * 0x50,(pvVar37->alloc).hugepages);
        }
      }
      if (sVar50 != 0) {
        pMVar11 = (pvVar37->alloc).device;
        (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,sVar50 * -0x50,1);
      }
      pvVar37->size_active = 0;
      pvVar37->size_alloced = 0;
      pvVar37->items = (PrimRefMB *)0x0;
    }
    ::operator_delete(pvVar37);
  }
  local_19c0._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        )(_Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  BuildRecord::operator=((BuildRecord *)&children,(BuildRecord *)&isLeft);
  BuildRecord::operator=
            ((BuildRecord *)&children.children.items[children.numChildren].depth,
             (BuildRecord *)&vSplitPos);
  children.numChildren = children.numChildren + 1;
  std::
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 *)&local_19c0);
  local_19a0._8_8_ = &this->heuristicTemporalSplit;
  local_1a28._8_4_ = 0x7f800000;
  local_1a28._0_8_ = 0x7f8000007f800000;
  local_1a28._12_4_ = 0x7f800000;
  local_1a08._8_4_ = 0xff800000;
  local_1a08._0_8_ = 0xff800000ff800000;
  local_1a08._12_4_ = 0xff800000;
  while (children.numChildren < (this->cfg).branchingFactor) {
    puVar40 = &children.children.items[0].prims.super_PrimInfoMB.object_range._end;
    sVar50 = 0xffffffffffffffff;
    fVar55 = -INFINITY;
    for (sVar51 = 0; children.numChildren != sVar51; sVar51 = sVar51 + 1) {
      if ((this->cfg).minLeafSize < *puVar40 - ((range<unsigned_long> *)(puVar40 + -1))->_begin) {
        auVar21 = vsubps_avx(*(undefined1 (*) [16])(puVar40 + -0xb),
                             *(undefined1 (*) [16])(puVar40 + -0xd));
        auVar65 = vsubps_avx(*(undefined1 (*) [16])(puVar40 + -7),
                             *(undefined1 (*) [16])(puVar40 + -9));
        auVar56 = vinsertps_avx(auVar65,auVar21,0x4c);
        auVar66 = vshufpd_avx(auVar21,auVar21,1);
        auVar66 = vinsertps_avx(auVar66,auVar65,0x9c);
        auVar21 = vinsertps_avx(auVar21,auVar65,0x1c);
        auVar69._0_4_ =
             auVar21._0_4_ * (auVar56._0_4_ + auVar66._0_4_) + auVar56._0_4_ * auVar66._0_4_;
        auVar69._4_4_ =
             auVar21._4_4_ * (auVar56._4_4_ + auVar66._4_4_) + auVar56._4_4_ * auVar66._4_4_;
        auVar69._8_4_ =
             auVar21._8_4_ * (auVar56._8_4_ + auVar66._8_4_) + auVar56._8_4_ * auVar66._8_4_;
        auVar69._12_4_ =
             auVar21._12_4_ * (auVar56._12_4_ + auVar66._12_4_) + auVar56._12_4_ * auVar66._12_4_;
        auVar56 = vhaddps_avx(auVar69,auVar69);
        fVar5 = auVar56._0_4_ * 0.5;
        if (fVar55 < fVar5) {
          sVar50 = sVar51;
          fVar55 = fVar5;
        }
      }
      puVar40 = puVar40 + 0x16;
    }
    if (sVar50 == 0xffffffffffffffff) break;
    lVar44 = sVar50 * 0xb0;
    isLeft.split = (Split *)(current->depth + 1);
    vSplitPos.field_0.v[0] = (longlong)isLeft.split;
    set = &children.children.items[sVar50].prims;
    find((Split *)&time_range0,this,set);
    switch(uStack_160c) {
    case 0:
      vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
      vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
      local_18c8._0_8_ = (LocalChildList_conflict *)0xff800000ff800000;
      local_18c8._8_8_ = (PrimRefVector *)0xff800000ff800000;
      local_18b8._0_8_ = (SetMB *)0x7f8000007f800000;
      local_18b8.m128[2] = INFINITY;
      local_18b8.m128[3] = INFINITY;
      local_18a8[0].m128[0] = -INFINITY;
      local_18a8[0].m128[1] = -INFINITY;
      local_18a8[0].m128[2] = -INFINITY;
      local_18a8[0].m128[3] = -INFINITY;
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = 0x3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      vmovlps_avx(auVar73);
      _reduction = (code *)0x7f8000007f800000;
      local_1788 = 0;
      uStack_1780 = 0;
      vmovlps_avx(auVar73);
      sVar51 = children.children.items[sVar50].prims.super_PrimInfoMB.object_range._end;
      auVar25._4_4_ = uStack_160c;
      auVar25._0_4_ = local_1610.pos;
      auVar25._8_8_ = sStack_1608;
      vSplitPos_1.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar25,0);
      time_range1 = *(BBox1f *)
                     (mm_lookupmask_ps + (long)(1 << (time_range0.upper._0_1_ & 0x1f)) * 0x10);
      _reduction2 = &time_range0;
      sVar32 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                         (*(PrimRefMB **)(*(long *)((long)values + lVar44 + -0xcf0) + 0x20),
                          children.children.items[sVar50].prims.super_PrimInfoMB.object_range._begin
                          ,sVar51,(EmptyTy *)local_17f8,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                          (anon_class_24_3_c5d13451 *)&reduction2,(anon_class_1_0_00000001 *)&lprims
                          ,&reduction2_1,0x80,0xc00);
      local_18e8 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar44 + -0xcf0);
      uVar48 = *(ulong *)((long)values + lVar44 + -0xcf8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft.vSplitMask,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask);
      auVar59._8_8_ = 0;
      auVar59._0_4_ = local_18f0.lower;
      auVar59._4_4_ = local_18f0.upper;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar48;
      auVar66 = vcmpps_avx(auVar59,auVar22,1);
      auVar21 = vinsertps_avx(auVar22,auVar59,0x50);
      auVar56 = vblendps_avx(auVar59,auVar22,2);
      auVar56 = vblendvps_avx(auVar56,auVar21,auVar66);
      local_18f0 = (BBox1f)vmovlps_avx(auVar56);
      pvVar37 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  **)((long)values + lVar44 + -0xcf0);
      uVar48 = *(ulong *)((long)values + lVar44 + -0xcf8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1748.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction);
      auVar60._8_8_ = 0;
      auVar60._0_4_ = local_16c0.lower;
      auVar60._4_4_ = local_16c0.upper;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar48;
      auVar66 = vcmpps_avx(auVar60,auVar23,1);
      auVar21 = vinsertps_avx(auVar23,auVar60,0x50);
      auVar56 = vblendps_avx(auVar60,auVar23,2);
      auVar56 = vblendvps_avx(auVar56,auVar21,auVar66);
      local_16c0 = (BBox1f)vmovlps_avx(auVar56);
      local_16e8 = sVar32;
      local_16e0 = sVar51;
      local_16b8 = pvVar37;
      break;
    case 1:
      SetMB::deterministic_order(set);
      splitFallback(this,set,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1748.field_1);
      break;
    case 2:
      time_range0_1.lower = *(float *)((long)values + lVar44 + -0xcf8);
      time_range0_1.upper = local_1610.fpos;
      time_range1_1.lower = local_1610.fpos;
      time_range1_1.upper = *(float *)((long)values + lVar44 + -0xcf4);
      BVar33 = *(BBox1f *)((long)values + lVar44 + -0xcf0);
      _Var34.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      puVar13 = *(undefined8 **)local_19a0._8_8_;
      *(undefined8 *)
       ((long)_Var34.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 0x20) = 0;
      BVar41 = (BBox1f)children.children.items[sVar50].prims.super_PrimInfoMB.object_range._end;
      uVar42 = children.children.items[sVar50].prims.super_PrimInfoMB.object_range._begin;
      *(undefined8 **)
       _Var34.
       super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = puVar13;
      *(undefined1 *)
       ((long)_Var34.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 8) = 0;
      *(undefined8 *)
       ((long)_Var34.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 0x10) = 0;
      *(undefined8 *)
       ((long)_Var34.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 0x18) = 0;
      lVar44 = (long)BVar41 - uVar42;
      BVar53 = BVar41;
      if (lVar44 != 0) {
        uVar48 = lVar44 * 0x50;
        (**(code **)*puVar13)(puVar13,uVar48,0);
        if (uVar48 < 0x1c00000) {
          pvVar35 = alignedMalloc(uVar48,0x10);
        }
        else {
          pvVar35 = os_malloc(uVar48,(bool *)((long)_Var34.
                                                  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        *(void **)((long)_Var34.
                         super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         .
                         super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                         ._M_head_impl + 0x20) = pvVar35;
        *(long *)((long)_Var34.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x10) = lVar44;
        *(long *)((long)_Var34.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x18) = lVar44;
        BVar41 = (BBox1f)children.children.items[sVar50].prims.super_PrimInfoMB.object_range._begin;
        BVar53 = (BBox1f)children.children.items[sVar50].prims.super_PrimInfoMB.object_range._end;
      }
      vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
      vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
      auVar61._8_4_ = 0x3f800000;
      auVar61._0_8_ = 0x3f8000003f800000;
      auVar61._12_4_ = 0x3f800000;
      uVar48 = vmovlps_avx(auVar61);
      new_vector_1._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )_Var34.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims_1 = (PrimRefVector)
                 _Var34.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl;
      time_range1 = BVar33;
      if ((ulong)((long)BVar53 - (long)BVar41) < 0xc00) {
        _reduction2 = BVar41;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&reduction,(anon_class_40_5_808acc65 *)&time_range1,
                   (range<unsigned_long> *)&reduction2);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&reduction2,(context_traits)0x4,CUSTOM_CTX);
        vSplitPos_1.field_0._8_4_ = BVar41.lower;
        vSplitPos_1.field_0._12_4_ = BVar41.upper;
        vSplitPos_1.field_0._0_4_ = BVar53.lower;
        vSplitPos_1.field_0._4_4_ = BVar53.upper;
        lprims = (PrimRefVector)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19a8 = &time_range1;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,(d1 *)&vSplitPos_1,
                   (blocked_range<unsigned_long> *)&vSplitMask,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lprims,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&reduction2,(task_group_context *)this);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&reduction2);
        if (cVar30 != '\0') {
          prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar36,"task cancelled");
          __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&reduction2);
      }
      uVar42 = children.children.items[sVar50].prims.super_PrimInfoMB.object_range._end -
               children.children.items[sVar50].prims.super_PrimInfoMB.object_range._begin;
      if (uStack_1780 - local_1788 != uVar42) {
        vSplitMask.field_0._0_8_ = &time_range0_1;
        uStack_1780 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                (lprims_1->items,0,uVar42,0x400,
                                 (anon_class_8_1_41ce32a5 *)&vSplitMask);
      }
      auVar26._4_4_ = time_range0_1.upper;
      auVar26._0_4_ = time_range0_1.lower;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar48 >> 0x20;
      auVar26._8_8_ = 0;
      auVar66 = vcmpps_avx(auVar62,auVar26,1);
      auVar21 = vinsertps_avx(auVar26,auVar62,0x50);
      auVar56 = vblendps_avx(auVar62,auVar26,2);
      auVar56 = vblendvps_avx(auVar56,auVar21,auVar66);
      vmovlps_avx(auVar56);
      SetMB::operator=((SetMB *)&isLeft.vSplitMask,(SetMB *)&vSplitMask);
      pBVar49 = (BBox1f *)children.children.items[sVar50].prims.super_PrimInfoMB.object_range._begin
      ;
      vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
      vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
      local_18c8._0_8_ = (LocalChildList_conflict *)0xff800000ff800000;
      local_18c8._8_8_ = (PrimRefVector *)0xff800000ff800000;
      local_18b8._0_8_ = (SetMB *)0x7f8000007f800000;
      local_18b8.m128[2] = INFINITY;
      local_18b8.m128[3] = INFINITY;
      local_18a8[0].m128[0] = -INFINITY;
      local_18a8[0].m128[1] = -INFINITY;
      local_18a8[0].m128[2] = -INFINITY;
      local_18a8[0].m128[3] = -INFINITY;
      auVar63._8_4_ = 0x3f800000;
      auVar63._0_8_ = 0x3f8000003f800000;
      auVar63._12_4_ = 0x3f800000;
      uVar48 = vmovlps_avx(auVar63);
      pmVar14 = (PrimRefVector)
                children.children.items[sVar50].prims.super_PrimInfoMB.object_range._end;
      _reduction2_1 = BVar33;
      if ((ulong)((long)pmVar14 - (long)pBVar49) < 0xc00) {
        vSplitPos_1.field_0.v[1] = (longlong)pmVar14;
        vSplitPos_1.field_0.v[0] = (longlong)pBVar49;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&reduction2,(anon_class_24_3_35f68c7c *)&reduction2_1,
                   (range<unsigned_long> *)&vSplitPos_1);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos_1,(context_traits)0x4,CUSTOM_CTX);
        local_19a0._0_8_ = 0x80;
        local_17f8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_17f8._8_8_ = &reduction2_1;
        lprims = pmVar14;
        local_19a8 = pBVar49;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction2,(d1 *)&lprims,
                   (blocked_range<unsigned_long> *)&vSplitMask,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_17f8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos_1,(task_group_context *)this);
        cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos_1);
        if (cVar30 != '\0') {
          prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar36,"task cancelled");
          __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos_1)
        ;
      }
      lVar44 = local_1640 - local_1648;
      local_1648 = children.children.items[sVar50].prims.super_PrimInfoMB.object_range._begin;
      local_1640 = lVar44 + local_1648;
      uVar42 = children.children.items[sVar50].prims.super_PrimInfoMB.object_range._end;
      if (lVar44 != uVar42 - local_1648) {
        vSplitMask.field_0._0_8_ = &time_range1_1;
        local_1640 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (*(PrimRefMB **)((long)BVar33 + 0x20),local_1648,uVar42,0x400,
                                (anon_class_8_1_41ce32a6 *)&vSplitMask);
      }
      local_1a38._4_4_ = time_range1_1.upper;
      local_1a38._0_4_ = time_range1_1.lower;
      local_1a38._8_8_ = 0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction2);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar48 >> 0x20;
      auVar66 = vcmpps_avx(auVar64,local_1a38,1);
      auVar21 = vinsertps_avx(local_1a38,auVar64,0x50);
      auVar56 = vblendps_avx(auVar64,local_1a38,2);
      auVar56 = vblendvps_avx(auVar56,auVar21,auVar66);
      vmovlps_avx(auVar56);
      SetMB::operator=((SetMB *)&local_1748.field_1,(SetMB *)&vSplitMask);
      _Var52._M_head_impl =
           (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
            *)new_vector_1;
      goto LAB_00ce6697;
    case 3:
      SetMB::deterministic_order(set);
      splitByGeometry(this,set,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1748.field_1);
      break;
    default:
      _Var52._M_head_impl =
           (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
            *)0x0;
      goto LAB_00ce6697;
    }
    _Var52._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
LAB_00ce6697:
    sVar51 = children.numSharedPrimVecs;
    new_vector_1._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar12 = children.primvecs.items[sVar50];
    if (local_18e8 == pSVar12->prims) {
      pSVar12->refCount = pSVar12->refCount + 1;
      pvVar37 = local_18e8;
    }
    else {
      pSVar28 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar29 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar29->prims = local_18e8;
      children.sharedPrimVecs.items[sVar51].refCount = 1;
      children.primvecs.items[sVar50] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar28->prims;
      pvVar37 = pSVar12->prims;
    }
    sVar51 = children.numSharedPrimVecs;
    if (local_16b8 == pvVar37) {
      children.primvecs.items[children.numChildren] = pSVar12;
      sVar51 = pSVar12->refCount;
      pSVar12->refCount = sVar51 + 1;
    }
    else {
      pSVar28 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar29 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar29->prims = local_16b8;
      children.sharedPrimVecs.items[sVar51].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar28->prims;
      sVar51 = pSVar12->refCount - 1;
    }
    pSVar12->refCount = sVar51;
    if (sVar51 == 0) {
      pvVar37 = pSVar12->prims;
      local_19c8._M_head_impl = _Var52._M_head_impl;
      if (pvVar37 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar51 = pvVar37->size_alloced;
        pPVar10 = pvVar37->items;
        if (pPVar10 != (PrimRefMB *)0x0) {
          if (sVar51 * 0x50 < 0x1c00000) {
            alignedFree(pPVar10);
          }
          else {
            os_free(pPVar10,sVar51 * 0x50,(pvVar37->alloc).hugepages);
          }
        }
        if (sVar51 != 0) {
          pMVar11 = (pvVar37->alloc).device;
          (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,sVar51 * -0x50,1);
        }
        pvVar37->size_active = 0;
        pvVar37->size_alloced = 0;
        pvVar37->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar37);
    }
    local_19c8._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecord::operator=
              ((BuildRecord *)&children.children.items[sVar50].depth,(BuildRecord *)&isLeft);
    BuildRecord::operator=
              ((BuildRecord *)&children.children.items[children.numChildren].depth,
               (BuildRecord *)&vSplitPos);
    children.numChildren = children.numChildren + 1;
    bVar43 = bVar43 | (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                       )_Var52._M_head_impl !=
                      (_Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                       )0x0;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_19c8);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector_1);
  }
  pfVar39 = &children.children.items[0].prims.super_PrimInfoMB.time_range.upper;
  sVar50 = children.numChildren;
  while (bVar54 = sVar50 != 0, sVar50 = sVar50 - 1, bVar54) {
    auVar56 = vcmpps_avx(ZEXT416((uint)(current->prims).super_PrimInfoMB.time_range.lower),
                         ZEXT416((uint)((BBox1f *)(pfVar39 + -1))->lower),1);
    auVar66 = vcmpps_avx(ZEXT416((uint)*pfVar39),
                         ZEXT416((uint)(current->prims).super_PrimInfoMB.time_range.upper),1);
    auVar56 = vorps_avx(auVar56,auVar66);
    bVar43 = bVar43 | auVar56[0];
    pfVar39 = pfVar39 + 0x2c;
  }
  if ((bVar43 & 1) == 0) {
    _reduction = (code *)&DAT_000000e0;
    pTVar15 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar15->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar15;
      MutexSys::lock(&pTVar15->mutex);
      if ((pTVar15->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar3 = &((pTVar15->alloc)._M_b._M_p)->bytesUsed;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar15->alloc1).bytesUsed + (pTVar15->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar15->alloc)._M_b._M_p)->bytesFree;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar15->alloc0).end + (pTVar15->alloc1).end) -
             ((pTVar15->alloc0).cur + (pTVar15->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar15->alloc)._M_b._M_p)->bytesWasted;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar15->alloc1).bytesWasted + (pTVar15->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar68 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar15->alloc0).end = auVar68._0_8_;
      (pTVar15->alloc0).allocBlockSize = auVar68._8_8_;
      (pTVar15->alloc0).bytesUsed = auVar68._16_8_;
      (pTVar15->alloc0).bytesWasted = auVar68._24_8_;
      (pTVar15->alloc0).ptr = (char *)auVar68._0_8_;
      (pTVar15->alloc0).cur = auVar68._8_8_;
      (pTVar15->alloc0).end = auVar68._16_8_;
      (pTVar15->alloc0).allocBlockSize = auVar68._24_8_;
      auVar68 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar15->alloc1).end = auVar68._0_8_;
        (pTVar15->alloc1).allocBlockSize = auVar68._8_8_;
        (pTVar15->alloc1).bytesUsed = auVar68._16_8_;
        (pTVar15->alloc1).bytesWasted = auVar68._24_8_;
        (pTVar15->alloc1).ptr = (char *)auVar68._0_8_;
        (pTVar15->alloc1).cur = auVar68._8_8_;
        (pTVar15->alloc1).end = auVar68._16_8_;
        (pTVar15->alloc1).allocBlockSize = auVar68._24_8_;
      }
      else {
        (pTVar15->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar15->alloc1).ptr = (char *)auVar68._0_8_;
        (pTVar15->alloc1).cur = auVar68._8_8_;
        (pTVar15->alloc1).end = auVar68._16_8_;
        (pTVar15->alloc1).allocBlockSize = auVar68._24_8_;
        (pTVar15->alloc1).end = auVar68._0_8_;
        (pTVar15->alloc1).allocBlockSize = auVar68._8_8_;
        (pTVar15->alloc1).bytesUsed = auVar68._16_8_;
        (pTVar15->alloc1).bytesWasted = auVar68._24_8_;
        (pTVar15->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar15->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar15;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&vSplitMask);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&isLeft);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&vSplitPos);
    }
    (alloc.talloc0)->bytesUsed = (size_t)((alloc.talloc0)->bytesUsed + (long)_reduction);
    sVar50 = (alloc.talloc0)->cur;
    uVar48 = (ulong)(-(int)sVar50 & 0xf);
    puVar45 = (undefined1 *)(sVar50 + (long)_reduction) + uVar48;
    (alloc.talloc0)->cur = (size_t)puVar45;
    if ((undefined1 *)(alloc.talloc0)->end < puVar45) {
      (alloc.talloc0)->cur = sVar50;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar46;
        sVar50 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar50;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar46;
          sVar50 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar50;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar46 = (char *)0x0;
            goto LAB_00ce7279;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar50;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar48;
      pcVar46 = (alloc.talloc0)->ptr + ((long)puVar45 - (long)_reduction);
    }
LAB_00ce7279:
    pcVar46[0x60] = '\0';
    pcVar46[0x61] = '\0';
    pcVar46[0x62] = -0x80;
    pcVar46[99] = '\x7f';
    pcVar46[100] = '\0';
    pcVar46[0x65] = '\0';
    pcVar46[0x66] = -0x80;
    pcVar46[0x67] = '\x7f';
    pcVar46[0x68] = '\0';
    pcVar46[0x69] = '\0';
    pcVar46[0x6a] = -0x80;
    pcVar46[0x6b] = '\x7f';
    pcVar46[0x6c] = '\0';
    pcVar46[0x6d] = '\0';
    pcVar46[0x6e] = -0x80;
    pcVar46[0x6f] = '\x7f';
    pcVar46[0x40] = '\0';
    pcVar46[0x41] = '\0';
    pcVar46[0x42] = -0x80;
    pcVar46[0x43] = '\x7f';
    pcVar46[0x44] = '\0';
    pcVar46[0x45] = '\0';
    pcVar46[0x46] = -0x80;
    pcVar46[0x47] = '\x7f';
    pcVar46[0x48] = '\0';
    pcVar46[0x49] = '\0';
    pcVar46[0x4a] = -0x80;
    pcVar46[0x4b] = '\x7f';
    pcVar46[0x4c] = '\0';
    pcVar46[0x4d] = '\0';
    pcVar46[0x4e] = -0x80;
    pcVar46[0x4f] = '\x7f';
    pcVar46[0x20] = '\0';
    pcVar46[0x21] = '\0';
    pcVar46[0x22] = -0x80;
    pcVar46[0x23] = '\x7f';
    pcVar46[0x24] = '\0';
    pcVar46[0x25] = '\0';
    pcVar46[0x26] = -0x80;
    pcVar46[0x27] = '\x7f';
    pcVar46[0x28] = '\0';
    pcVar46[0x29] = '\0';
    pcVar46[0x2a] = -0x80;
    pcVar46[0x2b] = '\x7f';
    pcVar46[0x2c] = '\0';
    pcVar46[0x2d] = '\0';
    pcVar46[0x2e] = -0x80;
    pcVar46[0x2f] = '\x7f';
    pcVar46[0x70] = '\0';
    pcVar46[0x71] = '\0';
    pcVar46[0x72] = -0x80;
    pcVar46[0x73] = -1;
    pcVar46[0x74] = '\0';
    pcVar46[0x75] = '\0';
    pcVar46[0x76] = -0x80;
    pcVar46[0x77] = -1;
    pcVar46[0x78] = '\0';
    pcVar46[0x79] = '\0';
    pcVar46[0x7a] = -0x80;
    pcVar46[0x7b] = -1;
    pcVar46[0x7c] = '\0';
    pcVar46[0x7d] = '\0';
    pcVar46[0x7e] = -0x80;
    pcVar46[0x7f] = -1;
    pcVar46[0x50] = '\0';
    pcVar46[0x51] = '\0';
    pcVar46[0x52] = -0x80;
    pcVar46[0x53] = -1;
    pcVar46[0x54] = '\0';
    pcVar46[0x55] = '\0';
    pcVar46[0x56] = -0x80;
    pcVar46[0x57] = -1;
    pcVar46[0x58] = '\0';
    pcVar46[0x59] = '\0';
    pcVar46[0x5a] = -0x80;
    pcVar46[0x5b] = -1;
    pcVar46[0x5c] = '\0';
    pcVar46[0x5d] = '\0';
    pcVar46[0x5e] = -0x80;
    pcVar46[0x5f] = -1;
    pcVar46[0x30] = '\0';
    pcVar46[0x31] = '\0';
    pcVar46[0x32] = -0x80;
    pcVar46[0x33] = -1;
    pcVar46[0x34] = '\0';
    pcVar46[0x35] = '\0';
    pcVar46[0x36] = -0x80;
    pcVar46[0x37] = -1;
    pcVar46[0x38] = '\0';
    pcVar46[0x39] = '\0';
    pcVar46[0x3a] = -0x80;
    pcVar46[0x3b] = -1;
    pcVar46[0x3c] = '\0';
    pcVar46[0x3d] = '\0';
    pcVar46[0x3e] = -0x80;
    pcVar46[0x3f] = -1;
    auVar56 = ZEXT816(0);
    *(undefined1 (*) [32])(pcVar46 + 0x80) = ZEXT1632(auVar56);
    *(undefined1 (*) [32])(pcVar46 + 0xa0) = ZEXT1632(auVar56);
    *(undefined1 (*) [32])(pcVar46 + 0xc0) = ZEXT1632(auVar56);
    for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
      pcVar4 = pcVar46 + lVar44 * 8;
      pcVar4[0] = '\b';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
    }
    goto LAB_00ce72e2;
  }
  _reduction = (code *)&DAT_00000100;
  pTVar15 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar15->alloc)._M_b._M_p) {
    vSplitPos.field_0.v[1]._0_1_ = 1;
    vSplitPos.field_0.v[0] = (longlong)pTVar15;
    MutexSys::lock(&pTVar15->mutex);
    if ((pTVar15->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar3 = &((pTVar15->alloc)._M_b._M_p)->bytesUsed;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar15->alloc1).bytesUsed + (pTVar15->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar15->alloc)._M_b._M_p)->bytesFree;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar15->alloc0).end + (pTVar15->alloc1).end) -
           ((pTVar15->alloc0).cur + (pTVar15->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar15->alloc)._M_b._M_p)->bytesWasted;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar15->alloc1).bytesWasted + (pTVar15->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar68 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar15->alloc0).end = auVar68._0_8_;
    (pTVar15->alloc0).allocBlockSize = auVar68._8_8_;
    (pTVar15->alloc0).bytesUsed = auVar68._16_8_;
    (pTVar15->alloc0).bytesWasted = auVar68._24_8_;
    (pTVar15->alloc0).ptr = (char *)auVar68._0_8_;
    (pTVar15->alloc0).cur = auVar68._8_8_;
    (pTVar15->alloc0).end = auVar68._16_8_;
    (pTVar15->alloc0).allocBlockSize = auVar68._24_8_;
    auVar68 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar15->alloc1).end = auVar68._0_8_;
      (pTVar15->alloc1).allocBlockSize = auVar68._8_8_;
      (pTVar15->alloc1).bytesUsed = auVar68._16_8_;
      (pTVar15->alloc1).bytesWasted = auVar68._24_8_;
      (pTVar15->alloc1).ptr = (char *)auVar68._0_8_;
      (pTVar15->alloc1).cur = auVar68._8_8_;
      (pTVar15->alloc1).end = auVar68._16_8_;
      (pTVar15->alloc1).allocBlockSize = auVar68._24_8_;
    }
    else {
      (pTVar15->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar15->alloc1).ptr = (char *)auVar68._0_8_;
      (pTVar15->alloc1).cur = auVar68._8_8_;
      (pTVar15->alloc1).end = auVar68._16_8_;
      (pTVar15->alloc1).allocBlockSize = auVar68._24_8_;
      (pTVar15->alloc1).end = auVar68._0_8_;
      (pTVar15->alloc1).allocBlockSize = auVar68._8_8_;
      (pTVar15->alloc1).bytesUsed = auVar68._16_8_;
      (pTVar15->alloc1).bytesWasted = auVar68._24_8_;
      (pTVar15->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar15->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
    isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
    vSplitMask.field_0._0_8_ = pTVar15;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&vSplitMask);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&isLeft);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&vSplitPos);
  }
  (alloc.talloc0)->bytesUsed = (size_t)((alloc.talloc0)->bytesUsed + (long)_reduction);
  sVar50 = (alloc.talloc0)->cur;
  uVar48 = (ulong)(-(int)sVar50 & 0xf);
  puVar45 = (undefined1 *)(sVar50 + (long)_reduction) + uVar48;
  (alloc.talloc0)->cur = (size_t)puVar45;
  if ((undefined1 *)(alloc.talloc0)->end < puVar45) {
    (alloc.talloc0)->cur = sVar50;
    if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
      pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
    }
    else {
      isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
      pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
      (alloc.talloc0)->ptr = pcVar46;
      sVar50 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar50;
      (alloc.talloc0)->end = (size_t)isLeft.split;
      (alloc.talloc0)->cur = (size_t)_reduction;
      if (isLeft.split < _reduction) {
        (alloc.talloc0)->cur = 0;
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar46 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar46;
        sVar50 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar50;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          pcVar46 = (char *)0x0;
          goto LAB_00ce7149;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar50;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar48;
    pcVar46 = (alloc.talloc0)->ptr + ((long)puVar45 - (long)_reduction);
  }
LAB_00ce7149:
  pcVar46[0xe0] = '\0';
  pcVar46[0xe1] = '\0';
  pcVar46[0xe2] = -0x80;
  pcVar46[0xe3] = '\x7f';
  pcVar46[0xe4] = '\0';
  pcVar46[0xe5] = '\0';
  pcVar46[0xe6] = -0x80;
  pcVar46[0xe7] = '\x7f';
  pcVar46[0xe8] = '\0';
  pcVar46[0xe9] = '\0';
  pcVar46[0xea] = -0x80;
  pcVar46[0xeb] = '\x7f';
  pcVar46[0xec] = '\0';
  pcVar46[0xed] = '\0';
  pcVar46[0xee] = -0x80;
  pcVar46[0xef] = '\x7f';
  pcVar46[0xf0] = '\0';
  pcVar46[0xf1] = '\0';
  pcVar46[0xf2] = -0x80;
  pcVar46[0xf3] = -1;
  pcVar46[0xf4] = '\0';
  pcVar46[0xf5] = '\0';
  pcVar46[0xf6] = -0x80;
  pcVar46[0xf7] = -1;
  pcVar46[0xf8] = '\0';
  pcVar46[0xf9] = '\0';
  pcVar46[0xfa] = -0x80;
  pcVar46[0xfb] = -1;
  pcVar46[0xfc] = '\0';
  pcVar46[0xfd] = '\0';
  pcVar46[0xfe] = -0x80;
  pcVar46[0xff] = -1;
  pcVar46[0x60] = '\0';
  pcVar46[0x61] = '\0';
  pcVar46[0x62] = -0x80;
  pcVar46[99] = '\x7f';
  pcVar46[100] = '\0';
  pcVar46[0x65] = '\0';
  pcVar46[0x66] = -0x80;
  pcVar46[0x67] = '\x7f';
  pcVar46[0x68] = '\0';
  pcVar46[0x69] = '\0';
  pcVar46[0x6a] = -0x80;
  pcVar46[0x6b] = '\x7f';
  pcVar46[0x6c] = '\0';
  pcVar46[0x6d] = '\0';
  pcVar46[0x6e] = -0x80;
  pcVar46[0x6f] = '\x7f';
  pcVar46[0x40] = '\0';
  pcVar46[0x41] = '\0';
  pcVar46[0x42] = -0x80;
  pcVar46[0x43] = '\x7f';
  pcVar46[0x44] = '\0';
  pcVar46[0x45] = '\0';
  pcVar46[0x46] = -0x80;
  pcVar46[0x47] = '\x7f';
  pcVar46[0x48] = '\0';
  pcVar46[0x49] = '\0';
  pcVar46[0x4a] = -0x80;
  pcVar46[0x4b] = '\x7f';
  pcVar46[0x4c] = '\0';
  pcVar46[0x4d] = '\0';
  pcVar46[0x4e] = -0x80;
  pcVar46[0x4f] = '\x7f';
  pcVar46[0x20] = '\0';
  pcVar46[0x21] = '\0';
  pcVar46[0x22] = -0x80;
  pcVar46[0x23] = '\x7f';
  pcVar46[0x24] = '\0';
  pcVar46[0x25] = '\0';
  pcVar46[0x26] = -0x80;
  pcVar46[0x27] = '\x7f';
  pcVar46[0x28] = '\0';
  pcVar46[0x29] = '\0';
  pcVar46[0x2a] = -0x80;
  pcVar46[0x2b] = '\x7f';
  pcVar46[0x2c] = '\0';
  pcVar46[0x2d] = '\0';
  pcVar46[0x2e] = -0x80;
  pcVar46[0x2f] = '\x7f';
  pcVar46[0x70] = '\0';
  pcVar46[0x71] = '\0';
  pcVar46[0x72] = -0x80;
  pcVar46[0x73] = -1;
  pcVar46[0x74] = '\0';
  pcVar46[0x75] = '\0';
  pcVar46[0x76] = -0x80;
  pcVar46[0x77] = -1;
  pcVar46[0x78] = '\0';
  pcVar46[0x79] = '\0';
  pcVar46[0x7a] = -0x80;
  pcVar46[0x7b] = -1;
  pcVar46[0x7c] = '\0';
  pcVar46[0x7d] = '\0';
  pcVar46[0x7e] = -0x80;
  pcVar46[0x7f] = -1;
  pcVar46[0x50] = '\0';
  pcVar46[0x51] = '\0';
  pcVar46[0x52] = -0x80;
  pcVar46[0x53] = -1;
  pcVar46[0x54] = '\0';
  pcVar46[0x55] = '\0';
  pcVar46[0x56] = -0x80;
  pcVar46[0x57] = -1;
  pcVar46[0x58] = '\0';
  pcVar46[0x59] = '\0';
  pcVar46[0x5a] = -0x80;
  pcVar46[0x5b] = -1;
  pcVar46[0x5c] = '\0';
  pcVar46[0x5d] = '\0';
  pcVar46[0x5e] = -0x80;
  pcVar46[0x5f] = -1;
  pcVar46[0x30] = '\0';
  pcVar46[0x31] = '\0';
  pcVar46[0x32] = -0x80;
  pcVar46[0x33] = -1;
  pcVar46[0x34] = '\0';
  pcVar46[0x35] = '\0';
  pcVar46[0x36] = -0x80;
  pcVar46[0x37] = -1;
  pcVar46[0x38] = '\0';
  pcVar46[0x39] = '\0';
  pcVar46[0x3a] = -0x80;
  pcVar46[0x3b] = -1;
  pcVar46[0x3c] = '\0';
  pcVar46[0x3d] = '\0';
  pcVar46[0x3e] = -0x80;
  pcVar46[0x3f] = -1;
  auVar56 = ZEXT816(0);
  *(undefined1 (*) [32])(pcVar46 + 0x80) = ZEXT1632(auVar56);
  *(undefined1 (*) [32])(pcVar46 + 0xa0) = ZEXT1632(auVar56);
  *(undefined1 (*) [32])(pcVar46 + 0xc0) = ZEXT1632(auVar56);
  local_1990 = (undefined1  [8])0x6;
  for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
    pcVar4 = pcVar46 + lVar44 * 8;
    pcVar4[0] = '\b';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
  }
LAB_00ce72e2:
  sVar50 = children.numChildren;
  if ((this->cfg).singleThreadThreshold <
      (current->prims).super_PrimInfoMB.object_range._end -
      (current->prims).super_PrimInfoMB.object_range._begin) {
    vSplitMask.field_0._0_8_ = values;
    vSplitMask.field_0._8_8_ = this;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
    vSplitPos.field_0.v[1] = 0;
    vSplitPos.field_0.v[0] = sVar50;
    local_1748._0_8_ = 1;
    _reduction = (code *)&vSplitMask;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::avx::BVHBuilderMSMBlur::BuilderT<embree::NodeRefPtr<4>,embree::avx::RecalculatePrimRef<embree::Instance>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::avx::CreateMSMBlurLeaf<4,embree::Instance,embree::InstancePrimitive>,embree::Scene::BuildProgressMonitorInterface>::recurse(embree::avx::BVHBuilderMSMBlur::BuildRecord_const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::avx::BVHBuilderMSMBlur::BuilderT<embree::NodeRefPtr<4>,embree::avx::RecalculatePrimRef<embree::Instance>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::avx::CreateMSMBlurLeaf<4,embree::Instance,embree::InstancePrimitive>,embree::Scene::BuildProgressMonitorInterface>::recurse(embree::avx::BVHBuilderMSMBlur::BuildRecord_const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)&vSplitPos,(anon_class_8_1_898bcfc2 *)&reduction,
               (task_group_context *)&isLeft);
    cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
    if (cVar30 != '\0') {
      prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar36,"task cancelled");
      __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
    local_1a38._8_4_ = 0x7f800000;
    local_1a38._0_8_ = 0x7f8000007f800000;
    local_1a38._12_4_ = 0x7f800000;
    local_1a48._8_4_ = 0xff800000;
    local_1a48._0_8_ = 0xff800000ff800000;
    local_1a48._12_4_ = 0xff800000;
    paVar38 = &values[0].lbounds.bounds1.upper.field_0;
    sVar50 = children.numChildren;
    local_1a28 = local_1a38;
    local_1a08 = local_1a48;
    while (bVar54 = sVar50 != 0, sVar50 = sVar50 - 1, local_18c8._0_8_ = &children, bVar54) {
      local_1a38 = vminps_avx(local_1a38,(undefined1  [16])paVar38[-3]);
      local_1a48 = vmaxps_avx(local_1a48,(undefined1  [16])paVar38[-2]);
      local_1a28 = vminps_avx(local_1a28,*(undefined1 (*) [16])&paVar38[-1].field_1.x);
      local_1a08 = vmaxps_avx(local_1a08,(undefined1  [16])*paVar38);
      paVar38 = paVar38 + 6;
    }
  }
  else {
    current_00 = (BuildRecord *)(children.children.items + children.numChildren);
    pBVar49 = &values[children.numChildren - 1].dt;
    local_1a48._8_4_ = 0xff800000;
    local_1a48._0_8_ = 0xff800000ff800000;
    local_1a48._12_4_ = 0xff800000;
    local_1a38._8_4_ = 0x7f800000;
    local_1a38._0_8_ = 0x7f8000007f800000;
    local_1a38._12_4_ = 0x7f800000;
    while( true ) {
      sVar50 = sVar50 - 1;
      current_00 = current_00 + -1;
      if ((long)sVar50 < 0) break;
      alloc_01.talloc0 = alloc.talloc0;
      alloc_01.alloc = alloc.alloc;
      alloc_01.talloc1 = alloc.talloc1;
      recurse((NodeRecordMB4D *)&isLeft,this,current_00,alloc_01,false);
      pBVar49[-10] = (BBox1f)isLeft.split;
      auVar24._8_8_ = auStack_1970._0_8_;
      auVar24._0_8_ = isLeft.vSplitMask;
      *(undefined1 (*) [16])(pBVar49 + -8) = auVar24;
      *(undefined1 (*) [16])(pBVar49 + -6) = auStack_1970._8_16_;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar49 + -4) = local_1958;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar49 + -2) = local_1948;
      pBVar49->lower = (float)local_1938._0_4_;
      pBVar49->upper = local_1938.m128[1];
      local_1a38 = vminps_avx(local_1a38,auVar24);
      local_1a48 = vmaxps_avx(local_1a48,auStack_1970._8_16_);
      local_1a28 = vminps_avx(local_1a28,(undefined1  [16])local_1958);
      local_1a08 = vmaxps_avx(local_1a08,(undefined1  [16])local_1948);
      pBVar49 = pBVar49 + -0xc;
    }
  }
  uVar48 = (ulong)local_1990 | (ulong)pcVar46;
  uVar47 = (ulong)pcVar46 & 0xfffffffffffffff0;
  if (((uint)uVar48 & 0xf) == 1) {
    pfVar39 = &values[0].dt.upper;
    auVar70._8_4_ = 0x7f7fffff;
    auVar70._0_8_ = 0x7f7fffff7f7fffff;
    auVar70._12_4_ = 0x7f7fffff;
    auVar74._8_4_ = 0xff7fffff;
    auVar74._0_8_ = 0xff7fffffff7fffff;
    auVar74._12_4_ = 0xff7fffff;
    auVar76._8_4_ = 0x7fffffff;
    auVar76._0_8_ = 0x7fffffff7fffffff;
    auVar76._12_4_ = 0x7fffffff;
    for (sVar50 = 0; children.numChildren != sVar50; sVar50 = sVar50 + 1) {
      *(undefined8 *)(uVar47 + sVar50 * 8) = *(undefined8 *)(pfVar39 + -0x15);
      fVar55 = ((BBox1f *)(pfVar39 + -1))->lower;
      fVar78 = 1.0 / (*pfVar39 - fVar55);
      fVar5 = -fVar55 * fVar78;
      auVar56 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
      auVar66 = vshufps_avx(ZEXT416((uint)(1.0 - fVar5)),ZEXT416((uint)(1.0 - fVar5)),0);
      auVar94._0_4_ = pfVar39[-9] * auVar56._0_4_ + pfVar39[-0x11] * auVar66._0_4_;
      auVar94._4_4_ = pfVar39[-8] * auVar56._4_4_ + pfVar39[-0x10] * auVar66._4_4_;
      auVar94._8_4_ = pfVar39[-7] * auVar56._8_4_ + pfVar39[-0xf] * auVar66._8_4_;
      auVar94._12_4_ = pfVar39[-6] * auVar56._12_4_ + pfVar39[-0xe] * auVar66._12_4_;
      auVar84._0_4_ = pfVar39[-5] * auVar56._0_4_ + pfVar39[-0xd] * auVar66._0_4_;
      auVar84._4_4_ = pfVar39[-4] * auVar56._4_4_ + pfVar39[-0xc] * auVar66._4_4_;
      auVar84._8_4_ = pfVar39[-3] * auVar56._8_4_ + pfVar39[-0xb] * auVar66._8_4_;
      auVar84._12_4_ = pfVar39[-2] * auVar56._12_4_ + pfVar39[-10] * auVar66._12_4_;
      fVar78 = (1.0 - fVar55) * fVar78;
      auVar56 = vshufps_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),0);
      auVar66 = vshufps_avx(ZEXT416((uint)(1.0 - fVar78)),ZEXT416((uint)(1.0 - fVar78)),0);
      auVar86._0_4_ = pfVar39[-9] * auVar56._0_4_ + pfVar39[-0x11] * auVar66._0_4_;
      auVar86._4_4_ = pfVar39[-8] * auVar56._4_4_ + pfVar39[-0x10] * auVar66._4_4_;
      auVar86._8_4_ = pfVar39[-7] * auVar56._8_4_ + pfVar39[-0xf] * auVar66._8_4_;
      auVar86._12_4_ = pfVar39[-6] * auVar56._12_4_ + pfVar39[-0xe] * auVar66._12_4_;
      auVar79._0_4_ = pfVar39[-5] * auVar56._0_4_ + pfVar39[-0xd] * auVar66._0_4_;
      auVar79._4_4_ = pfVar39[-4] * auVar56._4_4_ + pfVar39[-0xc] * auVar66._4_4_;
      auVar79._8_4_ = pfVar39[-3] * auVar56._8_4_ + pfVar39[-0xb] * auVar66._8_4_;
      auVar79._12_4_ = pfVar39[-2] * auVar56._12_4_ + pfVar39[-10] * auVar66._12_4_;
      auVar65 = vminps_avx(auVar94,auVar70);
      auVar66 = vmaxps_avx(auVar84,auVar74);
      auVar67 = vminps_avx(auVar86,auVar70);
      auVar21 = vmaxps_avx(auVar79,auVar74);
      auVar56 = vandps_avx(auVar65,auVar76);
      auVar89._0_4_ = auVar56._0_4_ * 4.7683716e-07;
      auVar89._4_4_ = auVar56._4_4_ * 4.7683716e-07;
      auVar89._8_4_ = auVar56._8_4_ * 4.7683716e-07;
      auVar89._12_4_ = auVar56._12_4_ * 4.7683716e-07;
      auVar65 = vsubps_avx(auVar65,auVar89);
      auVar56 = vandps_avx(auVar66,auVar76);
      auVar85._0_4_ = auVar66._0_4_ + auVar56._0_4_ * 4.7683716e-07;
      auVar85._4_4_ = auVar66._4_4_ + auVar56._4_4_ * 4.7683716e-07;
      auVar85._8_4_ = auVar66._8_4_ + auVar56._8_4_ * 4.7683716e-07;
      auVar85._12_4_ = auVar66._12_4_ + auVar56._12_4_ * 4.7683716e-07;
      auVar56 = vandps_avx(auVar67,auVar76);
      auVar90._0_4_ = auVar56._0_4_ * 4.7683716e-07;
      auVar90._4_4_ = auVar56._4_4_ * 4.7683716e-07;
      auVar90._8_4_ = auVar56._8_4_ * 4.7683716e-07;
      auVar90._12_4_ = auVar56._12_4_ * 4.7683716e-07;
      auVar66 = vsubps_avx(auVar67,auVar90);
      auVar56 = vandps_avx(auVar21,auVar76);
      *(int *)(uVar47 + 0x20 + sVar50 * 4) = auVar65._0_4_;
      uVar7 = vextractps_avx(auVar65,1);
      *(undefined4 *)(uVar47 + 0x40 + sVar50 * 4) = uVar7;
      auVar80._0_4_ = auVar56._0_4_ * 4.7683716e-07 + auVar21._0_4_;
      auVar80._4_4_ = auVar56._4_4_ * 4.7683716e-07 + auVar21._4_4_;
      auVar80._8_4_ = auVar56._8_4_ * 4.7683716e-07 + auVar21._8_4_;
      auVar80._12_4_ = auVar56._12_4_ * 4.7683716e-07 + auVar21._12_4_;
      uVar7 = vextractps_avx(auVar65,2);
      *(undefined4 *)(uVar47 + 0x60 + sVar50 * 4) = uVar7;
      *(float *)(uVar47 + 0x30 + sVar50 * 4) = auVar85._0_4_;
      uVar7 = vextractps_avx(auVar85,1);
      *(undefined4 *)(uVar47 + 0x50 + sVar50 * 4) = uVar7;
      auVar56 = vsubps_avx(auVar66,auVar65);
      uVar7 = vextractps_avx(auVar85,2);
      *(undefined4 *)(uVar47 + 0x70 + sVar50 * 4) = uVar7;
      *(int *)(uVar47 + 0x80 + sVar50 * 4) = auVar56._0_4_;
      uVar7 = vextractps_avx(auVar56,1);
      *(undefined4 *)(uVar47 + 0xa0 + sVar50 * 4) = uVar7;
      auVar66 = vsubps_avx(auVar80,auVar85);
      uVar7 = vextractps_avx(auVar56,2);
      *(undefined4 *)(uVar47 + 0xc0 + sVar50 * 4) = uVar7;
      *(int *)(uVar47 + 0x90 + sVar50 * 4) = auVar66._0_4_;
      uVar7 = vextractps_avx(auVar66,1);
      *(undefined4 *)(uVar47 + 0xb0 + sVar50 * 4) = uVar7;
      uVar7 = vextractps_avx(auVar66,2);
      *(undefined4 *)(uVar47 + 0xd0 + sVar50 * 4) = uVar7;
      pfVar39 = pfVar39 + 0x18;
    }
  }
  else {
    pfVar39 = &values[0].dt.upper;
    auVar71._8_4_ = 0x7f7fffff;
    auVar71._0_8_ = 0x7f7fffff7f7fffff;
    auVar71._12_4_ = 0x7f7fffff;
    auVar75._8_4_ = 0xff7fffff;
    auVar75._0_8_ = 0xff7fffffff7fffff;
    auVar75._12_4_ = 0xff7fffff;
    auVar77._8_4_ = 0x7fffffff;
    auVar77._0_8_ = 0x7fffffff7fffffff;
    auVar77._12_4_ = 0x7fffffff;
    auVar81._8_4_ = 0x3f800001;
    auVar81._0_8_ = 0x3f8000013f800001;
    auVar81._12_4_ = 0x3f800001;
    for (sVar50 = 0; children.numChildren != sVar50; sVar50 = sVar50 + 1) {
      *(undefined8 *)(uVar47 + sVar50 * 8) = *(undefined8 *)(pfVar39 + -0x15);
      fVar55 = ((BBox1f *)(pfVar39 + -1))->lower;
      fVar78 = 1.0 / (*pfVar39 - fVar55);
      fVar5 = -fVar55 * fVar78;
      auVar56 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
      auVar66 = vshufps_avx(ZEXT416((uint)(1.0 - fVar5)),ZEXT416((uint)(1.0 - fVar5)),0);
      auVar95._0_4_ = pfVar39[-9] * auVar56._0_4_ + pfVar39[-0x11] * auVar66._0_4_;
      auVar95._4_4_ = pfVar39[-8] * auVar56._4_4_ + pfVar39[-0x10] * auVar66._4_4_;
      auVar95._8_4_ = pfVar39[-7] * auVar56._8_4_ + pfVar39[-0xf] * auVar66._8_4_;
      auVar95._12_4_ = pfVar39[-6] * auVar56._12_4_ + pfVar39[-0xe] * auVar66._12_4_;
      auVar87._0_4_ = pfVar39[-5] * auVar56._0_4_ + pfVar39[-0xd] * auVar66._0_4_;
      auVar87._4_4_ = pfVar39[-4] * auVar56._4_4_ + pfVar39[-0xc] * auVar66._4_4_;
      auVar87._8_4_ = pfVar39[-3] * auVar56._8_4_ + pfVar39[-0xb] * auVar66._8_4_;
      auVar87._12_4_ = pfVar39[-2] * auVar56._12_4_ + pfVar39[-10] * auVar66._12_4_;
      fVar78 = (1.0 - fVar55) * fVar78;
      auVar56 = vshufps_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),0);
      auVar66 = vshufps_avx(ZEXT416((uint)(1.0 - fVar78)),ZEXT416((uint)(1.0 - fVar78)),0);
      auVar91._0_4_ = pfVar39[-9] * auVar56._0_4_ + pfVar39[-0x11] * auVar66._0_4_;
      auVar91._4_4_ = pfVar39[-8] * auVar56._4_4_ + pfVar39[-0x10] * auVar66._4_4_;
      auVar91._8_4_ = pfVar39[-7] * auVar56._8_4_ + pfVar39[-0xf] * auVar66._8_4_;
      auVar91._12_4_ = pfVar39[-6] * auVar56._12_4_ + pfVar39[-0xe] * auVar66._12_4_;
      auVar82._0_4_ = pfVar39[-0xd] * auVar66._0_4_ + pfVar39[-5] * auVar56._0_4_;
      auVar82._4_4_ = pfVar39[-0xc] * auVar66._4_4_ + pfVar39[-4] * auVar56._4_4_;
      auVar82._8_4_ = pfVar39[-0xb] * auVar66._8_4_ + pfVar39[-3] * auVar56._8_4_;
      auVar82._12_4_ = pfVar39[-10] * auVar66._12_4_ + pfVar39[-2] * auVar56._12_4_;
      auVar65 = vminps_avx(auVar95,auVar71);
      auVar66 = vmaxps_avx(auVar87,auVar75);
      auVar67 = vminps_avx(auVar91,auVar71);
      auVar21 = vmaxps_avx(auVar82,auVar75);
      auVar56 = vandps_avx(auVar65,auVar77);
      auVar92._0_4_ = auVar56._0_4_ * 4.7683716e-07;
      auVar92._4_4_ = auVar56._4_4_ * 4.7683716e-07;
      auVar92._8_4_ = auVar56._8_4_ * 4.7683716e-07;
      auVar92._12_4_ = auVar56._12_4_ * 4.7683716e-07;
      auVar65 = vsubps_avx(auVar65,auVar92);
      auVar56 = vandps_avx(auVar66,auVar77);
      auVar88._0_4_ = auVar66._0_4_ + auVar56._0_4_ * 4.7683716e-07;
      auVar88._4_4_ = auVar66._4_4_ + auVar56._4_4_ * 4.7683716e-07;
      auVar88._8_4_ = auVar66._8_4_ + auVar56._8_4_ * 4.7683716e-07;
      auVar88._12_4_ = auVar66._12_4_ + auVar56._12_4_ * 4.7683716e-07;
      auVar56 = vandps_avx(auVar67,auVar77);
      auVar93._0_4_ = auVar56._0_4_ * 4.7683716e-07;
      auVar93._4_4_ = auVar56._4_4_ * 4.7683716e-07;
      auVar93._8_4_ = auVar56._8_4_ * 4.7683716e-07;
      auVar93._12_4_ = auVar56._12_4_ * 4.7683716e-07;
      auVar66 = vsubps_avx(auVar67,auVar93);
      auVar56 = vandps_avx(auVar21,auVar77);
      *(int *)(uVar47 + 0x20 + sVar50 * 4) = auVar65._0_4_;
      uVar7 = vextractps_avx(auVar65,1);
      *(undefined4 *)(uVar47 + 0x40 + sVar50 * 4) = uVar7;
      auVar83._0_4_ = auVar56._0_4_ * 4.7683716e-07 + auVar21._0_4_;
      auVar83._4_4_ = auVar56._4_4_ * 4.7683716e-07 + auVar21._4_4_;
      auVar83._8_4_ = auVar56._8_4_ * 4.7683716e-07 + auVar21._8_4_;
      auVar83._12_4_ = auVar56._12_4_ * 4.7683716e-07 + auVar21._12_4_;
      uVar7 = vextractps_avx(auVar65,2);
      *(undefined4 *)(uVar47 + 0x60 + sVar50 * 4) = uVar7;
      *(float *)(uVar47 + 0x30 + sVar50 * 4) = auVar88._0_4_;
      uVar7 = vextractps_avx(auVar88,1);
      *(undefined4 *)(uVar47 + 0x50 + sVar50 * 4) = uVar7;
      auVar56 = vsubps_avx(auVar66,auVar65);
      uVar7 = vextractps_avx(auVar88,2);
      *(undefined4 *)(uVar47 + 0x70 + sVar50 * 4) = uVar7;
      *(int *)(uVar47 + 0x80 + sVar50 * 4) = auVar56._0_4_;
      uVar7 = vextractps_avx(auVar56,1);
      *(undefined4 *)(uVar47 + 0xa0 + sVar50 * 4) = uVar7;
      auVar66 = vsubps_avx(auVar83,auVar88);
      uVar7 = vextractps_avx(auVar56,2);
      *(undefined4 *)(uVar47 + 0xc0 + sVar50 * 4) = uVar7;
      *(int *)(uVar47 + 0x90 + sVar50 * 4) = auVar66._0_4_;
      uVar7 = vextractps_avx(auVar66,1);
      *(undefined4 *)(uVar47 + 0xb0 + sVar50 * 4) = uVar7;
      uVar7 = vextractps_avx(auVar66,2);
      *(undefined4 *)(uVar47 + 0xd0 + sVar50 * 4) = uVar7;
      *(float *)(uVar47 + 0xe0 + sVar50 * 4) = ((BBox1f *)(pfVar39 + -1))->lower;
      auVar56 = vcmpss_avx(ZEXT416((uint)*pfVar39),SUB6416(ZEXT464(0x3f800000),0),0);
      auVar56 = vblendvps_avx(ZEXT416((uint)*pfVar39),auVar81,auVar56);
      *(int *)(uVar47 + 0xf0 + sVar50 * 4) = auVar56._0_4_;
      pfVar39 = pfVar39 + 0x18;
    }
  }
  if ((bVar43 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = uVar48;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1a38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1a38._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1a48._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1a48._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1a28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1a28._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1a08._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_1a08._8_8_;
    BVar33 = (current->prims).super_PrimInfoMB.time_range;
  }
  else {
    vSplitPos_1.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos_1.field_0.v[0] = (longlong)pSVar17;
    pSVar16 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pSVar17 = (SetMB *)(current->prims).super_PrimInfoMB.object_range._end;
    vSplitPos.field_0.i[2] = 0x7f800000;
    vSplitPos.field_0.v[0] = 0x7f8000007f800000;
    vSplitPos.field_0.i[3] = 0x7f800000;
    local_1748._0_8_ = 0xff800000ff800000;
    local_1748.m128[2] = -INFINITY;
    local_1748.m128[3] = -INFINITY;
    local_1738.m128[0] = INFINITY;
    local_1738.m128[1] = INFINITY;
    local_1738.m128[2] = INFINITY;
    local_1738.m128[3] = INFINITY;
    local_1728[0].m128[0] = -INFINITY;
    local_1728[0].m128[1] = -INFINITY;
    local_1728[0].m128[2] = -INFINITY;
    local_1728[0].m128[3] = -INFINITY;
    if ((ulong)((long)pSVar17 - (long)pSVar16) < 0xc00) {
      isLeft.split = pSVar16;
      isLeft.vSplitPos = (vint *)pSVar17;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vSplitMask,(anon_class_16_2_aeee9775 *)&vSplitPos_1,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
      _reduction2 = &time_range0;
      _reduction = (code *)pSVar17;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vSplitMask,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&vSplitPos,(LBBox<embree::Vec3fa> *)&reduction2,
                 (anon_class_16_2_ed117de8_conflict31 *)_reduction2,
                 (anon_class_1_0_00000001 *)&isLeft,(task_group_context *)this);
      cVar30 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar30 != '\0') {
        prVar36 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar36,"task cancelled");
        __cxa_throw(prVar36,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
    }
    (__return_storage_ptr__->ref).ptr = uVar48;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         vSplitMask.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         vSplitMask.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_18c8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_18c8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_18b8._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_18b8.m128[3],local_18b8.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 =
         CONCAT44(local_18a8[0].m128[1],local_18a8[0].m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         CONCAT44(local_18a8[0].m128[3],local_18a8[0].m128[2]);
    BVar33 = (current->prims).super_PrimInfoMB.time_range;
  }
  __return_storage_ptr__->dt = BVar33;
  for (uVar48 = 0; uVar48 < children.numChildren; uVar48 = uVar48 + 1) {
    pSVar12 = children.primvecs.items[uVar48];
    psVar1 = &pSVar12->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar37 = pSVar12->prims;
      if (pvVar37 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar50 = pvVar37->size_alloced;
        pPVar10 = pvVar37->items;
        if (pPVar10 != (PrimRefMB *)0x0) {
          if (sVar50 * 0x50 < 0x1c00000) {
            alignedFree(pPVar10);
          }
          else {
            os_free(pPVar10,sVar50 * 0x50,(pvVar37->alloc).hugepages);
          }
        }
        if (sVar50 != 0) {
          pMVar11 = (pvVar37->alloc).device;
          (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,sVar50 * -0x50,1);
        }
        pvVar37->size_active = 0;
        pvVar37->size_alloced = 0;
        pvVar37->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar37);
    }
  }
  std::
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ::~unique_ptr(&new_vector);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D recurse(const BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            const Split csplit = find(current.prims);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*current.prims.halfArea()+cfg.intCost*csplit.splitSAH();
            assert((current.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              current.prims.deterministic_order();
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            SetMB lprims,rprims;
            std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,current.prims,lprims,rprims);
            bool hasTimeSplits = new_vector != nullptr;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildList children(current);
            {
              BuildRecord lrecord(lprims,current.depth+1);
              BuildRecord rrecord(rprims,current.depth+1);
              children.split(0,lrecord,rrecord,std::move(new_vector));
            }

            /*! split until node is full or SAH tells us to stop */
            while (children.size() < cfg.branchingFactor) 
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<children.size(); i++)
              {
                if (children[i].size() <= cfg.minLeafSize) continue;
                if (expectedApproxHalfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i; bestArea = expectedApproxHalfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              Split csplit = find(brecord.prims);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));
            }

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = current.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* sort buildrecords for simpler shadow ray traversal */
            //std::sort(&children[0],&children[children.size()],std::greater<BuildRecord>()); // FIXME: reduces traversal performance of bvh8.triangle4 (need to verified) !!

            /*! create an inner node */
            auto node = createNode(children.children.data(), children.numChildren, alloc, hasTimeSplits);
            LBBox3fa gbounds = empty;

            /* spawn tasks */
            if (unlikely(current.size() > cfg.singleThreadThreshold))
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), children.size(), [&] (const range<size_t>& r) {
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              /*! merge bounding boxes */
              for (size_t i=0; i<children.size(); i++)
                gbounds.extend(values[i].lbounds);
            }
            /* recurse into each child */
            else
            {
              //for (size_t i=0; i<children.size(); i++)
              for (ssize_t i=children.size()-1; i>=0; i--) {
                values[i] = recurse(children[i],alloc,false);
                gbounds.extend(values[i].lbounds);
              }
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (unlikely(hasTimeSplits))
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }